

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_xpriv_derive_hardened_Test::TestBody(Descriptor_xpriv_derive_hardened_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  char *pcVar2;
  char *rhs;
  reference pvVar3;
  char *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f10;
  AssertHelper local_1ee8;
  Message local_1ee0;
  Pubkey local_1ed8;
  string local_1ec0;
  undefined1 local_1ea0 [8];
  AssertionResult gtest_ar_6;
  Message local_1e88;
  ExtPubkey local_1e80;
  string local_1e10;
  undefined1 local_1df0 [8];
  AssertionResult gtest_ar_5;
  Message local_1dd8;
  ExtPrivkey local_1dd0;
  string local_1d58;
  undefined1 local_1d38 [8];
  AssertionResult gtest_ar_4;
  Message local_1d20;
  int local_1d14;
  size_type local_1d10;
  undefined1 local_1d08 [8];
  AssertionResult gtest_ar_3;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  keylist;
  AssertHelper local_1cc0;
  Message local_1cb8;
  bool local_1ca9;
  undefined1 local_1ca8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1c78;
  Message local_1c70;
  bool local_1c61;
  undefined1 local_1c60 [8];
  AssertionResult gtest_ar__2;
  undefined1 local_1900 [8];
  DescriptorScriptReference pkh_ref;
  Message local_15a8;
  DescriptorScriptReference local_15a0;
  Script local_1250;
  string local_1218;
  undefined1 local_11f8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_11c8;
  Message local_11c0;
  DescriptorScriptReference local_11b8;
  bool local_e61;
  undefined1 local_e60 [8];
  AssertionResult gtest_ar__1;
  Message local_e48;
  Script local_e40;
  string local_e08;
  undefined1 local_de8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_db8;
  Message local_db0;
  bool local_da1;
  undefined1 local_da0 [8];
  AssertionResult gtest_ar_;
  Message local_d88;
  string local_d80;
  undefined1 local_d60 [8];
  AssertionResult gtest_ar;
  Message local_d48;
  DescriptorScriptReference local_d40;
  AssertHelper local_9f0;
  Message local_9e8;
  DescriptorNode local_9e0;
  AssertHelper local_878;
  Message local_870 [2];
  Descriptor local_860;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6f3;
  undefined1 local_6f2;
  allocator local_6f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  iterator local_6c8;
  size_type local_6c0;
  undefined1 local_6b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list;
  DescriptorNode node;
  DescriptorScriptReference script_ref;
  Script locking_script;
  Descriptor desc;
  allocator local_31;
  undefined1 local_30 [8];
  string descriptor;
  Descriptor_xpriv_derive_hardened_Test *this_local;
  
  descriptor.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "sh(wsh(pkh(xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN/0\'/44/*\')))"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::Descriptor::Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script
            ((Script *)
             &script_ref.addr_prefixes_.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::DescriptorScriptReference::DescriptorScriptReference
            ((DescriptorScriptReference *)((long)&node.parent_kind_.field_2 + 8));
  cfd::core::DescriptorNode::DescriptorNode
            ((DescriptorNode *)
             &arg_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_6f2 = 1;
  local_6f0 = &local_6e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6e8,"0\'/0\'",&local_6f1);
  local_6f2 = 0;
  local_6c8 = &local_6e8;
  local_6c0 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_6f3);
  __l._M_len = local_6c0;
  __l._M_array = local_6c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_6b8,__l,&local_6f3);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_6f3);
  local_1f10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6c8;
  do {
    local_1f10 = local_1f10 + -1;
    std::__cxx11::string::~string((string *)local_1f10);
  } while (local_1f10 != &local_6e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::Parse
                (&local_860,(string *)local_30,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      cfd::core::Descriptor::operator=
                ((Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_860);
      cfd::core::Descriptor::~Descriptor(&local_860);
    }
  }
  else {
    testing::Message::Message(local_870);
    testing::internal::AssertHelper::AssertHelper
              (&local_878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x397,
               "Expected: desc = Descriptor::Parse(descriptor) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_878,local_870);
    testing::internal::AssertHelper::~AssertHelper(&local_878);
    testing::Message::~Message(local_870);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetNode
                (&local_9e0,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::DescriptorNode::operator=
                ((DescriptorNode *)
                 &arg_list.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_9e0);
      cfd::core::DescriptorNode::~DescriptorNode(&local_9e0);
    }
  }
  else {
    testing::Message::Message(&local_9e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_9f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x398,
               "Expected: node = desc.GetNode() doesn\'t throw an exception.\n  Actual: it throws.")
    ;
    testing::internal::AssertHelper::operator=(&local_9f0,&local_9e8);
    testing::internal::AssertHelper::~AssertHelper(&local_9f0);
    testing::Message::~Message(&local_9e8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReference
                (&local_d40,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_6b8);
      cfd::core::DescriptorScriptReference::operator=
                ((DescriptorScriptReference *)((long)&node.parent_kind_.field_2 + 8),&local_d40);
      cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_d40);
    }
  }
  else {
    testing::Message::Message(&local_d48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x399,
               "Expected: script_ref = desc.GetReference(&arg_list) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_d48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_d48);
  }
  cfd::core::DescriptorNode::ToString_abi_cxx11_
            (&local_d80,
             (DescriptorNode *)
             &arg_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_d60,"node.ToString(false).c_str()","descriptor.c_str()",pcVar2,rhs);
  std::__cxx11::string::~string((string *)&local_d80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d60);
  if (!bVar1) {
    testing::Message::Message(&local_d88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x39a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_d88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_d88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d60);
  local_da1 = cfd::core::DescriptorScriptReference::HasRedeemScript
                        ((DescriptorScriptReference *)((long)&node.parent_kind_.field_2 + 8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_da0,&local_da1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_da0);
  if (!bVar1) {
    testing::Message::Message(&local_db0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_da0,
               (AssertionResult *)"script_ref.HasRedeemScript()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_db8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x39b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_db8,&local_db0);
    testing::internal::AssertHelper::~AssertHelper(&local_db8);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_db0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_da0);
  cfd::core::DescriptorScriptReference::GetRedeemScript
            (&local_e40,(DescriptorScriptReference *)((long)&node.parent_kind_.field_2 + 8));
  cfd::core::Script::ToString_abi_cxx11_(&local_e08,&local_e40);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_de8,"script_ref.GetRedeemScript().ToString().c_str()",
             "\"0 7b2bb92ed714a0534e2a35442f5e4f2718a77143d74edefca3f9fa72bbca9723\"",pcVar2,
             "0 7b2bb92ed714a0534e2a35442f5e4f2718a77143d74edefca3f9fa72bbca9723");
  std::__cxx11::string::~string((string *)&local_e08);
  cfd::core::Script::~Script(&local_e40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_de8);
  if (!bVar1) {
    testing::Message::Message(&local_e48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_de8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x39d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_e48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_e48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_de8);
  cfd::core::DescriptorScriptReference::GetChild
            (&local_11b8,(DescriptorScriptReference *)((long)&node.parent_kind_.field_2 + 8));
  local_e61 = cfd::core::DescriptorScriptReference::HasRedeemScript(&local_11b8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e60,&local_e61,(type *)0x0);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_11b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e60);
  if (!bVar1) {
    testing::Message::Message(&local_11c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_e60,
               (AssertionResult *)"script_ref.GetChild().HasRedeemScript()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_11c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x39e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_11c8,&local_11c0);
    testing::internal::AssertHelper::~AssertHelper(&local_11c8);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_11c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e60);
  cfd::core::DescriptorScriptReference::GetChild
            (&local_15a0,(DescriptorScriptReference *)((long)&node.parent_kind_.field_2 + 8));
  cfd::core::DescriptorScriptReference::GetRedeemScript(&local_1250,&local_15a0);
  cfd::core::Script::ToString_abi_cxx11_(&local_1218,&local_1250);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_11f8,"script_ref.GetChild().GetRedeemScript().ToString().c_str()",
             "\"OP_DUP OP_HASH160 1f030158408c421e09107cc81916f82f470a9df4 OP_EQUALVERIFY OP_CHECKSIG\""
             ,pcVar2,
             "OP_DUP OP_HASH160 1f030158408c421e09107cc81916f82f470a9df4 OP_EQUALVERIFY OP_CHECKSIG"
            );
  std::__cxx11::string::~string((string *)&local_1218);
  cfd::core::Script::~Script(&local_1250);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_15a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11f8);
  if (!bVar1) {
    testing::Message::Message(&local_15a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_11f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &pkh_ref.addr_prefixes_.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3a0,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &pkh_ref.addr_prefixes_.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_15a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &pkh_ref.addr_prefixes_.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_15a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11f8);
  cfd::core::DescriptorScriptReference::GetChild
            ((DescriptorScriptReference *)&gtest_ar__2.message_,
             (DescriptorScriptReference *)((long)&node.parent_kind_.field_2 + 8));
  cfd::core::DescriptorScriptReference::GetChild
            ((DescriptorScriptReference *)local_1900,
             (DescriptorScriptReference *)&gtest_ar__2.message_);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference
            ((DescriptorScriptReference *)&gtest_ar__2.message_);
  bVar1 = cfd::core::DescriptorScriptReference::HasRedeemScript
                    ((DescriptorScriptReference *)local_1900);
  local_1c61 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c60,&local_1c61,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c60);
  if (!bVar1) {
    testing::Message::Message(&local_1c70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_1c60,
               (AssertionResult *)"pkh_ref.HasRedeemScript()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3a2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c78,&local_1c70);
    testing::internal::AssertHelper::~AssertHelper(&local_1c78);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_1c70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c60);
  local_1ca9 = cfd::core::DescriptorScriptReference::HasKey((DescriptorScriptReference *)local_1900)
  ;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1ca8,&local_1ca9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ca8);
  if (!bVar1) {
    testing::Message::Message(&local_1cb8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &keylist.
                super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_1ca8,
               (AssertionResult *)"pkh_ref.HasKey()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1cc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3a3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1cc0,&local_1cb8);
    testing::internal::AssertHelper::~AssertHelper(&local_1cc0);
    std::__cxx11::string::~string
              ((string *)
               &keylist.
                super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1cb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ca8);
  cfd::core::DescriptorScriptReference::GetKeyList
            ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              *)&gtest_ar_3.message_,(DescriptorScriptReference *)local_1900);
  local_1d10 = std::
               vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
               ::size((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                       *)&gtest_ar_3.message_);
  local_1d14 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_1d08,"keylist.size()","1",&local_1d10,&local_1d14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d08);
  if (!bVar1) {
    testing::Message::Message(&local_1d20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3a5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1d20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1d20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d08);
  bVar1 = std::
          vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
          ::empty((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   *)&gtest_ar_3.message_);
  if (!bVar1) {
    pvVar3 = std::
             vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             ::operator[]((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                           *)&gtest_ar_3.message_,0);
    cfd::core::DescriptorKeyReference::GetExtPrivkey(&local_1dd0,pvVar3);
    cfd::core::ExtPrivkey::ToString_abi_cxx11_(&local_1d58,&local_1dd0);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_1d38,"keylist[0].GetExtPrivkey().ToString().c_str()",
               "\"xprvABvmZt3VZFopkh2oWpe8ndMPU2nA3RahBPVutV6wQQN4rd353GNxoJg9KBsWi5sDompQVHUgJKb1eXYZmPrq7VykUyvxugUrMPWXes9jHSk\""
               ,pcVar2,
               "xprvABvmZt3VZFopkh2oWpe8ndMPU2nA3RahBPVutV6wQQN4rd353GNxoJg9KBsWi5sDompQVHUgJKb1eXYZmPrq7VykUyvxugUrMPWXes9jHSk"
              );
    std::__cxx11::string::~string((string *)&local_1d58);
    cfd::core::ExtPrivkey::~ExtPrivkey(&local_1dd0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d38);
    if (!bVar1) {
      testing::Message::Message(&local_1dd8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d38);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
                 ,0x3a8,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1dd8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_1dd8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d38);
    pvVar3 = std::
             vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             ::operator[]((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                           *)&gtest_ar_3.message_,0);
    cfd::core::DescriptorKeyReference::GetExtPubkey(&local_1e80,pvVar3);
    cfd::core::ExtPubkey::ToString_abi_cxx11_(&local_1e10,&local_1e80);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_1df0,"keylist[0].GetExtPubkey().ToString().c_str()",
               "\"xpub6Qv7yPaPPdN7yB7GcrB99mJ824ceStJYYcRWgsWYxju3jRNDaohDM6zdATtizz9TnE8Ra83b4RQSRcoj95xDsH4eLyb2wappmRy2bPdr28u\""
               ,pcVar2,
               "xpub6Qv7yPaPPdN7yB7GcrB99mJ824ceStJYYcRWgsWYxju3jRNDaohDM6zdATtizz9TnE8Ra83b4RQSRcoj95xDsH4eLyb2wappmRy2bPdr28u"
              );
    std::__cxx11::string::~string((string *)&local_1e10);
    cfd::core::ExtPubkey::~ExtPubkey(&local_1e80);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1df0);
    if (!bVar1) {
      testing::Message::Message(&local_1e88);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1df0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
                 ,0x3aa,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1e88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_1e88);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1df0);
    pvVar3 = std::
             vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             ::operator[]((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                           *)&gtest_ar_3.message_,0);
    cfd::core::DescriptorKeyReference::GetPubkey(&local_1ed8,pvVar3);
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_1ec0,&local_1ed8);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_1ea0,"keylist[0].GetPubkey().GetHex().c_str()",
               "\"0321d3b2d7b0e6c3679dd0ff8f02ec7713e8e6ae502e34692ae1eb247c25dcb7a1\"",pcVar2,
               "0321d3b2d7b0e6c3679dd0ff8f02ec7713e8e6ae502e34692ae1eb247c25dcb7a1");
    std::__cxx11::string::~string((string *)&local_1ec0);
    cfd::core::Pubkey::~Pubkey(&local_1ed8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ea0);
    if (!bVar1) {
      testing::Message::Message(&local_1ee0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1ea0);
      testing::internal::AssertHelper::AssertHelper
                (&local_1ee8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
                 ,0x3ac,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1ee8,&local_1ee0);
      testing::internal::AssertHelper::~AssertHelper(&local_1ee8);
      testing::Message::~Message(&local_1ee0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ea0);
  }
  std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)&gtest_ar_3.message_);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference
            ((DescriptorScriptReference *)local_1900);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_6b8);
  cfd::core::DescriptorNode::~DescriptorNode
            ((DescriptorNode *)
             &arg_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference
            ((DescriptorScriptReference *)((long)&node.parent_kind_.field_2 + 8));
  cfd::core::Script::~Script
            ((Script *)
             &script_ref.addr_prefixes_.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Descriptor::~Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Descriptor, xpriv_derive_hardened) {
  std::string descriptor = "sh(wsh(pkh(xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN/0'/44/*')))";
  Descriptor desc;
  Script locking_script;
  DescriptorScriptReference script_ref;
  DescriptorNode node;

  std::vector<std::string> arg_list{"0'/0'"};
  EXPECT_NO_THROW(desc = Descriptor::Parse(descriptor));
  EXPECT_NO_THROW(node = desc.GetNode());
  EXPECT_NO_THROW(script_ref = desc.GetReference(&arg_list));
  EXPECT_STREQ(node.ToString(false).c_str(), descriptor.c_str());
  EXPECT_TRUE(script_ref.HasRedeemScript());
  EXPECT_STREQ(script_ref.GetRedeemScript().ToString().c_str(),
      "0 7b2bb92ed714a0534e2a35442f5e4f2718a77143d74edefca3f9fa72bbca9723");
  EXPECT_TRUE(script_ref.GetChild().HasRedeemScript());
  EXPECT_STREQ(script_ref.GetChild().GetRedeemScript().ToString().c_str(),
      "OP_DUP OP_HASH160 1f030158408c421e09107cc81916f82f470a9df4 OP_EQUALVERIFY OP_CHECKSIG");
  DescriptorScriptReference pkh_ref = script_ref.GetChild().GetChild();
  EXPECT_FALSE(pkh_ref.HasRedeemScript());
  EXPECT_TRUE(pkh_ref.HasKey());
  std::vector<DescriptorKeyReference> keylist = pkh_ref.GetKeyList();
  EXPECT_EQ(keylist.size(), 1);
  if (!keylist.empty()) {
    EXPECT_STREQ(keylist[0].GetExtPrivkey().ToString().c_str(),
        "xprvABvmZt3VZFopkh2oWpe8ndMPU2nA3RahBPVutV6wQQN4rd353GNxoJg9KBsWi5sDompQVHUgJKb1eXYZmPrq7VykUyvxugUrMPWXes9jHSk");
    EXPECT_STREQ(keylist[0].GetExtPubkey().ToString().c_str(),
        "xpub6Qv7yPaPPdN7yB7GcrB99mJ824ceStJYYcRWgsWYxju3jRNDaohDM6zdATtizz9TnE8Ra83b4RQSRcoj95xDsH4eLyb2wappmRy2bPdr28u");
    EXPECT_STREQ(keylist[0].GetPubkey().GetHex().c_str(),
        "0321d3b2d7b0e6c3679dd0ff8f02ec7713e8e6ae502e34692ae1eb247c25dcb7a1");
  }
}